

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco-dump.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  FILE *f_00;
  string local_2a0 [32];
  string local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  string local_220 [32];
  undefined1 local_200 [8];
  RCO rco;
  int local_78;
  int arglen;
  int i;
  allocator local_61;
  string local_60 [8];
  string outdir;
  string local_40 [8];
  string file;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,".",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  for (local_78 = 0; local_78 < argc; local_78 = local_78 + 1) {
    if (argv[local_78] != (char *)0x0) {
      sVar1 = strlen(argv[local_78]);
      rco.mStringTable._M_h._M_single_bucket._4_4_ = (int)sVar1;
      if (2 < rco.mStringTable._M_h._M_single_bucket._4_4_) {
        if ((*argv[local_78] == '-') && (argv[local_78][1] == 'f')) {
          std::__cxx11::string::operator=(local_40,argv[local_78] + 2);
        }
        else if ((*argv[local_78] == '-') && (argv[local_78][2] == 'd')) {
          std::__cxx11::string::operator=(local_60,argv[local_78] + 2);
        }
      }
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    if (1 < argc) {
      std::__cxx11::string::operator=(local_40,argv[1]);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      argv_local._4_4_ = 1;
      rco.mStringTable._M_h._M_single_bucket._0_4_ = 1;
      goto LAB_00104a17;
    }
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  f_00 = fopen(pcVar3,"rb");
  if (f_00 == (FILE *)0x0) {
    argv_local._4_4_ = 1;
    rco.mStringTable._M_h._M_single_bucket._0_4_ = 1;
  }
  else {
    RCO::RCO((RCO *)local_200,(FILE *)f_00);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    if (*pcVar3 == ':') {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_220,(ulong)local_40);
      std::__cxx11::string::operator=(local_60,local_220);
      std::__cxx11::string::~string(local_220);
    }
    else {
      std::operator+(local_260,(char *)local_60);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_280,(ulong)local_40);
      std::operator+(local_240,local_260);
      std::__cxx11::string::operator=(local_60,(string *)local_240);
      std::__cxx11::string::~string((string *)local_240);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string((string *)local_260);
    }
    std::__cxx11::string::string(local_2a0,local_60);
    RCO::dump((RCO *)local_200,(string *)local_2a0);
    std::__cxx11::string::~string(local_2a0);
    argv_local._4_4_ = 0;
    rco.mStringTable._M_h._M_single_bucket._0_4_ = 1;
    RCO::~RCO((RCO *)local_200);
  }
LAB_00104a17:
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	FILE *f;
	std::string file;
	std::string outdir = ".";

	// Loop over arguments and handle accordingly.
	// -fINPUT_FILE
	// -dOUTPUT_DIR
	for (int i = 0; i < argc; i++)
	{
		if (argv[i] != nullptr)
		{
			int arglen = strlen(argv[i]);
			if (arglen > 2)
			{
				if (argv[i][0] == '-' && argv[i][1] == 'f')
				{
					file = &argv[i][2];
				}
				else if (argv[i][0] == '-' && argv[i][2] == 'd')
				{
					outdir = &argv[i][2];
				}
			}
		}
	}

	// If no -f or -d, attempt to parse any >1 args as input files, 
	// allows to keep supporting drag&drop on windows
	if (file.empty())
	{
		if (argc > 1)
			file = argv[1];
		
		if (file.empty())
			return 1;	
	}

	f = fopen(file.c_str(), "rb");
	if (!f)
		return 1;

	// Got an absolute file
	RCO rco(f);
	
	if (file[1] == ':')
		outdir = file.substr(0, file.length() - 4);
	else
		outdir = outdir + "/" + file.substr(0, file.length() - 4);
	rco.dump(outdir);

    return 0;
}